

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void fmt::internal::check_sign<char>(char **s,Arg *arg)

{
  CStringRef message;
  Arg *in_RSI;
  long *in_RDI;
  char sign;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  BasicCStringRef<char> local_48 [3];
  char *in_stack_ffffffffffffffd0;
  CStringRef in_stack_ffffffffffffffd8;
  
  require_numeric_argument(in_RSI,*(char *)*in_RDI);
  if ((in_RSI->type != UINT) && (in_RSI->type != ULONG_LONG)) {
    *in_RDI = *in_RDI + 1;
    return;
  }
  message.data_ = (char *)__cxa_allocate_exception(0x10);
  BasicCStringRef<char>::BasicCStringRef
            (local_48,"format specifier \'{}\' requires signed argument");
  format<char>(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  BasicCStringRef<char>::BasicCStringRef
            ((BasicCStringRef<char> *)message.data_,in_stack_ffffffffffffff98);
  FormatError::FormatError((FormatError *)in_stack_ffffffffffffff98,message);
  __cxa_throw(message.data_,&FormatError::typeinfo,FormatError::~FormatError);
}

Assistant:

void check_sign(const Char *&s, const Arg &arg) {
  char sign = static_cast<char>(*s);
  require_numeric_argument(arg, sign);
  if (arg.type == Arg::UINT || arg.type == Arg::ULONG_LONG) {
    FMT_THROW(FormatError(fmt::format(
      "format specifier '{}' requires signed argument", sign)));
  }
  ++s;
}